

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

bool __thiscall
crnlib::symbol_codec::decode_receive_static_huffman_data_model
          (symbol_codec *this,static_huffman_data_model *model,
          static_huffman_data_model *pDeltaModel)

{
  vector<unsigned_char> *this_00;
  uchar uVar1;
  bool bVar2;
  uint min_new_capacity;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint num_remaining;
  uint uVar10;
  static_huffman_data_model dm;
  static_huffman_data_model local_70;
  static_huffman_data_model *local_38;
  
  min_new_capacity = get_bits(this,0xe);
  if (min_new_capacity == 0) {
    static_huffman_data_model::clear(model);
    bVar2 = true;
  }
  else {
    this_00 = &model->m_code_sizes;
    uVar8 = (model->m_code_sizes).m_size;
    local_38 = pDeltaModel;
    if (uVar8 != min_new_capacity) {
      if (uVar8 <= min_new_capacity) {
        if ((model->m_code_sizes).m_capacity < min_new_capacity) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,min_new_capacity,uVar8 + 1 == min_new_capacity,1,
                     (object_mover)0x0,false);
        }
        uVar8 = (model->m_code_sizes).m_size;
        memset((model->m_code_sizes).m_p + uVar8,0,(ulong)(min_new_capacity - uVar8));
      }
      (model->m_code_sizes).m_size = min_new_capacity;
    }
    bVar2 = false;
    memset(this_00->m_p,0,(ulong)min_new_capacity);
    uVar3 = get_bits(this,5);
    if (0xffffffea < uVar3 - 0x16) {
      local_70.m_total_syms = 0;
      local_70.m_pDecode_tables._0_1_ = 0;
      local_70._41_8_ = 0;
      local_70.m_code_sizes.m_p = (uchar *)0x0;
      local_70.m_code_sizes.m_size = 0;
      local_70.m_code_sizes.m_capacity = 0;
      local_70.m_codes.m_p = (unsigned_short *)0x0;
      local_70.m_codes.m_size = 0;
      local_70.m_codes.m_capacity = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_70.m_code_sizes,0x15,false,1,(object_mover)0x0,false);
      memset(local_70.m_code_sizes.m_p + local_70.m_code_sizes.m_size,0,
             (ulong)(0x15 - local_70.m_code_sizes.m_size));
      local_70.m_code_sizes.m_size = 0x15;
      if (uVar3 != 0) {
        uVar9 = 0;
        do {
          uVar4 = get_bits(this,3);
          local_70.m_code_sizes.m_p[(byte)(&g_most_probable_codelength_codes)[uVar9]] = (uchar)uVar4
          ;
          uVar9 = uVar9 + 1;
        } while (uVar3 != uVar9);
      }
      bVar2 = static_huffman_data_model::prepare_decoder_tables(&local_70);
      uVar9 = 0;
      if (bVar2) {
        do {
          uVar8 = (uint)uVar9;
          uVar10 = min_new_capacity - uVar8;
          if (min_new_capacity <= uVar8) {
            if (min_new_capacity == uVar8) {
              if (((local_38 != (static_huffman_data_model *)0x0) && (local_38->m_total_syms != 0))
                 && (uVar8 = (local_38->m_code_sizes).m_size, uVar8 != 0)) {
                if (uVar8 < min_new_capacity) {
                  min_new_capacity = uVar8;
                }
                uVar9 = 0;
                do {
                  uVar10 = (uint)(local_38->m_code_sizes).m_p[uVar9] + (uint)this_00->m_p[uVar9];
                  uVar8 = uVar10 - 0x11 & 0xff;
                  if (uVar10 < 0x11) {
                    uVar8 = uVar10;
                  }
                  this_00->m_p[uVar9] = (uchar)uVar8;
                  uVar9 = uVar9 + 1;
                } while (min_new_capacity + (min_new_capacity == 0) != uVar9);
              }
              bVar2 = static_huffman_data_model::prepare_decoder_tables(model);
              uVar9 = (ulong)bVar2;
              goto LAB_001996f5;
            }
            break;
          }
          uVar3 = decode(this,&local_70);
          if (uVar3 < 0x11) {
            uVar7 = uVar9 & 0xffffffff;
            uVar9 = (ulong)(uVar8 + 1);
            this_00->m_p[uVar7] = (uchar)uVar3;
LAB_0019960e:
            bVar2 = true;
          }
          else if (uVar3 == 0x12) {
            uVar3 = get_bits(this,7);
            uVar5 = uVar3 + 0xb;
LAB_001995fd:
            bVar2 = false;
            uVar6 = uVar5;
            if (uVar10 < uVar5) {
              uVar6 = 0;
            }
            uVar9 = (ulong)(uVar8 + uVar6);
            if (uVar5 <= uVar10) goto LAB_0019960e;
          }
          else {
            if (uVar3 == 0x11) {
              uVar3 = get_bits(this,3);
              uVar5 = uVar3 + 3;
              goto LAB_001995fd;
            }
            if (uVar3 - 0x13 < 2) {
              if (uVar3 == 0x13) {
                uVar3 = get_bits(this,2);
                uVar5 = uVar3 + 3;
              }
              else {
                uVar3 = get_bits(this,6);
                uVar5 = uVar3 + 7;
              }
              bVar2 = false;
              if ((uVar8 != 0) && (uVar5 <= uVar10)) {
                uVar1 = this_00->m_p[uVar8 - 1];
                bVar2 = uVar1 != '\0';
                if (bVar2) {
                  bVar2 = true;
                  if (uVar8 < uVar5 + uVar8) {
                    uVar9 = uVar9 & 0xffffffff;
                    do {
                      this_00->m_p[uVar9] = uVar1;
                      uVar9 = uVar9 + 1;
                    } while (uVar5 + uVar8 != uVar9);
                  }
                }
              }
              if (bVar2) goto LAB_0019960e;
            }
            bVar2 = false;
          }
        } while (bVar2);
        uVar9 = 0;
      }
LAB_001996f5:
      bVar2 = SUB81(uVar9,0);
      static_huffman_data_model::~static_huffman_data_model(&local_70);
    }
  }
  return bVar2;
}

Assistant:

bool symbol_codec::decode_receive_static_huffman_data_model(static_huffman_data_model& model, static_huffman_data_model* pDeltaModel)
    {
        CRNLIB_ASSERT(m_mode == cDecoding);

        const uint total_used_syms = decode_bits(math::total_bits(prefix_coding::cMaxSupportedSyms));
        if (!total_used_syms)
        {
            model.clear();
            return true;
        }

        model.m_code_sizes.resize(total_used_syms);
        memset(&model.m_code_sizes[0], 0, sizeof(model.m_code_sizes[0]) * total_used_syms);

        const uint num_codelength_codes_to_send = decode_bits(5);
        if ((num_codelength_codes_to_send < 1) || (num_codelength_codes_to_send > cMaxCodelengthCodes))
        {
            return false;
        }

        static_huffman_data_model dm;
        dm.m_code_sizes.resize(cMaxCodelengthCodes);

        for (uint i = 0; i < num_codelength_codes_to_send; i++)
        {
            dm.m_code_sizes[g_most_probable_codelength_codes[i]] = static_cast<uint8>(decode_bits(3));
        }

        if (!dm.prepare_decoder_tables())
        {
            return false;
        }

        uint ofs = 0;
        while (ofs < total_used_syms)
        {
            const uint num_remaining = total_used_syms - ofs;

            uint code = decode(dm);
            if (code <= 16)
            {
                model.m_code_sizes[ofs++] = static_cast<uint8>(code);
            }
            else if (code == cSmallZeroRunCode)
            {
                uint len = decode_bits(cSmallZeroRunExtraBits) + cMinSmallZeroRunSize;
                if (len > num_remaining)
                {
                    return false;
                }
                ofs += len;
            }
            else if (code == cLargeZeroRunCode)
            {
                uint len = decode_bits(cLargeZeroRunExtraBits) + cMinLargeZeroRunSize;
                if (len > num_remaining)
                {
                    return false;
                }
                ofs += len;
            }
            else if ((code == cSmallRepeatCode) || (code == cLargeRepeatCode))
            {
                uint len;
                if (code == cSmallRepeatCode)
                {
                    len = decode_bits(cSmallNonZeroRunExtraBits) + cSmallMinNonZeroRunSize;
                }
                else
                {
                    len = decode_bits(cLargeNonZeroRunExtraBits) + cLargeMinNonZeroRunSize;
                }

                if ((!ofs) || (len > num_remaining))
                {
                    return false;
                }
                const uint prev = model.m_code_sizes[ofs - 1];
                if (!prev)
                {
                    return false;
                }
                const uint end = ofs + len;
                while (ofs < end)
                {
                    model.m_code_sizes[ofs++] = static_cast<uint8>(prev);
                }
            }
            else
            {
                CRNLIB_ASSERT(0);
                return false;
            }
        }

        if (ofs != total_used_syms)
        {
            return false;
        }

        if ((pDeltaModel) && (pDeltaModel->get_total_syms()))
        {
            uint n = math::minimum(pDeltaModel->m_code_sizes.size(), total_used_syms);
            for (uint i = 0; i < n; i++)
            {
                int codesize = model.m_code_sizes[i] + pDeltaModel->m_code_sizes[i];
                if (codesize > 16)
                {
                    codesize -= 17;
                }
                model.m_code_sizes[i] = static_cast<uint8>(codesize);
            }
        }

        return model.prepare_decoder_tables();
    }